

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

void ecp_comb_fixed(uchar *x,size_t d,uchar w,mbedtls_mpi *m)

{
  int iVar1;
  byte bVar2;
  size_t sVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  size_t pos;
  ulong uVar7;
  
  memset(x,0,d + 1);
  if (d != 0) {
    sVar3 = 0;
    do {
      if (w != '\0') {
        uVar7 = 0;
        pos = sVar3;
        do {
          iVar1 = mbedtls_mpi_get_bit(m,pos);
          x[sVar3] = x[sVar3] | (byte)(iVar1 << ((byte)uVar7 & 0x1f));
          uVar7 = uVar7 + 1;
          pos = pos + d;
        } while (w != uVar7);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != d);
    sVar3 = 0;
    bVar5 = 0;
    bVar2 = *x;
    do {
      bVar6 = x[sVar3 + 1] ^ bVar5;
      bVar4 = (~bVar6 & 1) * bVar2;
      bVar5 = bVar4 & bVar6 | x[sVar3 + 1] & bVar5;
      bVar4 = bVar6 ^ bVar4;
      x[sVar3 + 1] = bVar4;
      x[sVar3] = ~bVar6 << 7 | bVar2;
      sVar3 = sVar3 + 1;
      bVar2 = bVar4;
    } while (d != sVar3);
  }
  return;
}

Assistant:

static void ecp_comb_fixed( unsigned char x[], size_t d,
                            unsigned char w, const mbedtls_mpi *m )
{
    size_t i, j;
    unsigned char c, cc, adjust;

    memset( x, 0, d+1 );

    /* First get the classical comb values (except for x_d = 0) */
    for( i = 0; i < d; i++ )
        for( j = 0; j < w; j++ )
            x[i] |= mbedtls_mpi_get_bit( m, i + d * j ) << j;

    /* Now make sure x_1 .. x_d are odd */
    c = 0;
    for( i = 1; i <= d; i++ )
    {
        /* Add carry and update it */
        cc   = x[i] & c;
        x[i] = x[i] ^ c;
        c = cc;

        /* Adjust if needed, avoiding branches */
        adjust = 1 - ( x[i] & 0x01 );
        c   |= x[i] & ( x[i-1] * adjust );
        x[i] = x[i] ^ ( x[i-1] * adjust );
        x[i-1] |= adjust << 7;
    }
}